

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_table_column_metadata
              (sqlite3 *db,char *zDbName,char *zTableName,char *zColumnName,char **pzDataType,
              char **pzCollSeq,int *pNotNull,int *pPrimaryKey,int *pAutoinc)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Table *pTVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  Column *pCVar9;
  byte bVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  char *zErrMsg;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_48 = (char *)0x0;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (db->noSharedCache == '\0') {
    btreeEnterAll(db);
  }
  uVar2 = sqlite3Init(db,&local_48);
  local_38 = zTableName;
  if ((uVar2 != 0) || (pTVar4 = sqlite3FindTable(db,zTableName,zDbName), pTVar4 == (Table *)0x0)) {
LAB_001409b6:
    bVar1 = false;
    pcVar8 = (char *)0x0;
    uVar13 = 0;
    uVar11 = 0;
    pcVar12 = (char *)0x0;
    pcVar7 = (char *)0x0;
    goto LAB_001409d0;
  }
  if (pTVar4->pSelect != (Select *)0x0) {
    bVar1 = false;
    pcVar8 = (char *)0x0;
    uVar13 = 0;
    uVar11 = 0;
    pcVar12 = (char *)0x0;
    pcVar7 = (char *)0x0;
    goto LAB_001409d0;
  }
  pcVar8 = "INTEGER";
  if (zColumnName == (char *)0x0) {
    pcVar5 = (char *)0x0;
    bVar15 = false;
    bVar10 = 1;
    pcVar12 = (char *)0x0;
  }
  else {
    uVar11 = (uint)pTVar4->nCol;
    if ((int)uVar11 < 1) {
      uVar14 = 0;
      pCVar9 = (Column *)0x0;
LAB_00140ba1:
      uVar13 = (uint)uVar14;
      if (uVar13 == uVar11) goto LAB_00140ba6;
LAB_00140bde:
      if (pCVar9 != (Column *)0x0) {
        bVar10 = pCVar9->colFlags;
        pcVar12 = (char *)0x0;
        if ((bVar10 & 4) == 0) {
          pcVar8 = (char *)0x0;
        }
        else {
          local_40 = pCVar9->zName;
          sVar6 = strlen(local_40);
          pcVar8 = local_40 + sVar6 + 1;
        }
        pcVar5 = pCVar9->zColl;
        bVar15 = pCVar9->notNull != '\0';
        bVar10 = bVar10 & 1;
        if (uVar13 == (int)pTVar4->iPKey) {
          pcVar12 = (char *)(ulong)(pTVar4->tabFlags >> 3 & 1);
        }
        goto LAB_00140c66;
      }
    }
    else {
      pCVar9 = pTVar4->aCol;
      uVar14 = 0;
      do {
        iVar3 = sqlite3StrICmp(pCVar9->zName,zColumnName);
        if (iVar3 == 0) goto LAB_00140ba1;
        uVar14 = uVar14 + 1;
        pCVar9 = pCVar9 + 1;
      } while (uVar11 != uVar14);
LAB_00140ba6:
      if (((pTVar4->tabFlags & 0x20) != 0) || (iVar3 = sqlite3IsRowid(zColumnName), iVar3 == 0))
      goto LAB_001409b6;
      uVar13 = (uint)pTVar4->iPKey;
      if (-1 < (int)uVar13) {
        pCVar9 = pTVar4->aCol + (ushort)pTVar4->iPKey;
        goto LAB_00140bde;
      }
    }
    pcVar5 = (char *)0x0;
    bVar15 = false;
    bVar10 = 1;
    pcVar12 = (char *)0x0;
    pcVar8 = "INTEGER";
  }
LAB_00140c66:
  bVar1 = true;
  uVar11 = (uint)bVar10;
  uVar13 = (uint)bVar15;
  pcVar7 = "BINARY";
  if (pcVar5 != (char *)0x0) {
    pcVar7 = pcVar5;
  }
LAB_001409d0:
  if (db->noSharedCache == '\0') {
    local_40 = pcVar12;
    btreeLeaveAll(db);
    pcVar12 = local_40;
  }
  if (pzDataType != (char **)0x0) {
    *pzDataType = pcVar8;
  }
  if (pzCollSeq != (char **)0x0) {
    *pzCollSeq = pcVar7;
  }
  if (pNotNull != (int *)0x0) {
    *pNotNull = uVar13;
  }
  if (pPrimaryKey != (int *)0x0) {
    *pPrimaryKey = uVar11;
  }
  if (pAutoinc != (int *)0x0) {
    *pAutoinc = (int)pcVar12;
  }
  if (uVar2 == 0 && !bVar1) {
    if (local_48 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_48);
    }
    local_48 = sqlite3MPrintf(db,"no such table column: %s.%s",local_38,zColumnName);
    uVar2 = 1;
  }
  pcVar7 = "%s";
  if (local_48 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  sqlite3ErrorWithMsg(db,uVar2,pcVar7);
  if (local_48 != (char *)0x0) {
    sqlite3DbFreeNN(db,local_48);
  }
  if ((uVar2 == 0xc0a) || (db->mallocFailed != '\0')) {
    apiOomError(db);
    uVar2 = 7;
  }
  else {
    uVar2 = uVar2 & db->errMask;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return uVar2;
}

Assistant:

SQLITE_API int sqlite3_table_column_metadata(
  sqlite3 *db,                /* Connection handle */
  const char *zDbName,        /* Database name or NULL */
  const char *zTableName,     /* Table name */
  const char *zColumnName,    /* Column name */
  char const **pzDataType,    /* OUTPUT: Declared data type */
  char const **pzCollSeq,     /* OUTPUT: Collation sequence name */
  int *pNotNull,              /* OUTPUT: True if NOT NULL constraint exists */
  int *pPrimaryKey,           /* OUTPUT: True if column part of PK */
  int *pAutoinc               /* OUTPUT: True if column is auto-increment */
){
  int rc;
  char *zErrMsg = 0;
  Table *pTab = 0;
  Column *pCol = 0;
  int iCol = 0;
  char const *zDataType = 0;
  char const *zCollSeq = 0;
  int notnull = 0;
  int primarykey = 0;
  int autoinc = 0;


#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTableName==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif

  /* Ensure the database schema has been loaded */
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  rc = sqlite3Init(db, &zErrMsg);
  if( SQLITE_OK!=rc ){
    goto error_out;
  }

  /* Locate the table in question */
  pTab = sqlite3FindTable(db, zTableName, zDbName);
  if( !pTab || pTab->pSelect ){
    pTab = 0;
    goto error_out;
  }

  /* Find the column for which info is requested */
  if( zColumnName==0 ){
    /* Query for existance of table only */
  }else{
    for(iCol=0; iCol<pTab->nCol; iCol++){
      pCol = &pTab->aCol[iCol];
      if( 0==sqlite3StrICmp(pCol->zName, zColumnName) ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      if( HasRowid(pTab) && sqlite3IsRowid(zColumnName) ){
        iCol = pTab->iPKey;
        pCol = iCol>=0 ? &pTab->aCol[iCol] : 0;
      }else{
        pTab = 0;
        goto error_out;
      }
    }
  }

  /* The following block stores the meta information that will be returned
  ** to the caller in local variables zDataType, zCollSeq, notnull, primarykey
  ** and autoinc. At this point there are two possibilities:
  ** 
  **     1. The specified column name was rowid", "oid" or "_rowid_" 
  **        and there is no explicitly declared IPK column. 
  **
  **     2. The table is not a view and the column name identified an 
  **        explicitly declared column. Copy meta information from *pCol.
  */ 
  if( pCol ){
    zDataType = sqlite3ColumnType(pCol,0);
    zCollSeq = pCol->zColl;
    notnull = pCol->notNull!=0;
    primarykey  = (pCol->colFlags & COLFLAG_PRIMKEY)!=0;
    autoinc = pTab->iPKey==iCol && (pTab->tabFlags & TF_Autoincrement)!=0;
  }else{
    zDataType = "INTEGER";
    primarykey = 1;
  }
  if( !zCollSeq ){
    zCollSeq = sqlite3StrBINARY;
  }

error_out:
  sqlite3BtreeLeaveAll(db);

  /* Whether the function call succeeded or failed, set the output parameters
  ** to whatever their local counterparts contain. If an error did occur,
  ** this has the effect of zeroing all output parameters.
  */
  if( pzDataType ) *pzDataType = zDataType;
  if( pzCollSeq ) *pzCollSeq = zCollSeq;
  if( pNotNull ) *pNotNull = notnull;
  if( pPrimaryKey ) *pPrimaryKey = primarykey;
  if( pAutoinc ) *pAutoinc = autoinc;

  if( SQLITE_OK==rc && !pTab ){
    sqlite3DbFree(db, zErrMsg);
    zErrMsg = sqlite3MPrintf(db, "no such table column: %s.%s", zTableName,
        zColumnName);
    rc = SQLITE_ERROR;
  }
  sqlite3ErrorWithMsg(db, rc, (zErrMsg?"%s":0), zErrMsg);
  sqlite3DbFree(db, zErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}